

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O1

uint8_t * apx_signatureParser_parse_data_element
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  byte bVar1;
  apx_signatureParserState_t *paVar2;
  apx_dataElement_t *child;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  apx_typeCode_t type_code;
  int iVar9;
  uint8_t *puVar10;
  apx_dataElement_t *paVar11;
  byte *pbVar12;
  apx_signatureParserState_t *paVar13;
  byte *pbVar14;
  uint8_t *puVar15;
  byte bVar16;
  uint32_t array_len;
  uint32_t local_34;
  
  if (self->state == (apx_signatureParserState_t *)0x0) {
    __assert_fail("(self != NULL) && (self->state != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                  ,0xc5,
                  "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                 );
  }
  if (self->state->is_record == true) {
    puVar10 = bstr_match_pair(begin,end,'\"','\"','\\');
    iVar9 = 3;
    if (puVar10 <= begin) goto LAB_001385aa;
    puVar15 = begin + 1;
    pbVar12 = puVar10 + 1;
  }
  else {
    puVar10 = (uint8_t *)0x0;
    puVar15 = (uint8_t *)0x0;
    pbVar12 = begin;
  }
  if (end <= pbVar12) {
    return begin;
  }
  bVar1 = *pbVar12;
  bVar7 = false;
  if (bVar1 < 0x51) {
    if (bVar1 < 0x42) {
      if (bVar1 == 0x28) goto switchD_001384cd_caseD_5b;
      if (bVar1 == 0x41) {
        type_code = '\n';
        goto LAB_001384a1;
      }
      goto switchD_001384cd_caseD_52;
    }
    bVar6 = true;
    if (bVar1 == 0x42) {
      type_code = '\x0e';
LAB_00138508:
      bVar6 = true;
      bVar8 = false;
      bVar7 = false;
      goto LAB_00138514;
    }
    if (bVar1 == 0x43) {
      bVar8 = false;
      bVar7 = false;
      bVar4 = false;
      bVar3 = false;
      bVar5 = false;
      type_code = '\x01';
      goto LAB_0013851a;
    }
    if (bVar1 == 0x4c) {
      type_code = '\x03';
      goto LAB_00138508;
    }
LAB_001386b6:
    bVar6 = true;
    bVar8 = true;
    bVar4 = true;
    bVar3 = false;
    bVar5 = false;
    type_code = '\0';
    bVar7 = false;
    goto LAB_0013851a;
  }
  switch(bVar1) {
  case 0x51:
    type_code = '\x04';
    bVar7 = true;
    bVar8 = false;
    bVar6 = true;
    goto LAB_00138514;
  case 0x52:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
switchD_001384cd_caseD_52:
    goto LAB_001386b6;
  case 0x53:
    type_code = '\x02';
    goto LAB_00138508;
  case 0x54:
    type_code = '\x10';
    bVar8 = true;
    bVar7 = false;
    bVar6 = false;
    bVar3 = true;
    goto LAB_00138517;
  case 0x55:
    type_code = '\f';
    break;
  case 0x5b:
switchD_001384cd_caseD_5b:
    bVar8 = true;
    bVar7 = false;
    bVar6 = false;
    bVar4 = true;
    bVar3 = false;
    bVar5 = false;
    type_code = '\0';
    bVar16 = 1;
    goto LAB_0013851c;
  case 0x61:
    type_code = '\t';
    break;
  case 0x62:
    type_code = '\r';
    break;
  case 99:
    type_code = '\x05';
    goto LAB_0013876e;
  default:
    switch(bVar1) {
    case 0x6c:
      type_code = '\a';
      break;
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x74:
      goto switchD_001384cd_caseD_52;
    case 0x71:
      type_code = '\b';
      bVar8 = true;
      bVar7 = true;
      bVar6 = true;
      goto LAB_00138514;
    case 0x73:
      type_code = '\x06';
      break;
    case 0x75:
      type_code = '\v';
      goto LAB_001384a1;
    default:
      bVar6 = true;
      bVar8 = true;
      bVar4 = true;
      bVar3 = false;
      bVar5 = false;
      type_code = '\0';
      bVar16 = 0;
      if (bVar1 != 0x7b) goto LAB_0013851c;
      type_code = '\x0f';
      bVar8 = true;
      bVar7 = false;
      bVar6 = false;
      bVar4 = false;
      bVar3 = false;
      bVar5 = true;
      goto LAB_0013851a;
    }
LAB_0013876e:
    bVar6 = true;
    bVar7 = false;
    bVar8 = true;
    goto LAB_00138514;
  }
LAB_001384a1:
  bVar7 = false;
  bVar8 = true;
  bVar6 = false;
LAB_00138514:
  bVar3 = false;
LAB_00138517:
  bVar4 = false;
  bVar5 = false;
LAB_0013851a:
  bVar16 = 0;
LAB_0013851c:
  begin = pbVar12;
  if (bVar4 || bVar16 != 0) {
    iVar9 = (uint)bVar16 * 8 + 3;
    goto LAB_001385aa;
  }
  paVar11 = apx_dataElement_new(type_code);
  self->state->data_element = paVar11;
  if (paVar11 == (apx_dataElement_t *)0x0) {
    iVar9 = 2;
    goto LAB_001385aa;
  }
  begin = pbVar12 + 1;
  if (puVar15 != (uint8_t *)0x0) {
    if ((puVar10 == (uint8_t *)0x0) || (puVar10 < puVar15)) {
      __assert_fail("(name_end != NULL) && (name_begin <= name_end)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                    ,0x13b,
                    "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                   );
    }
    iVar9 = apx_dataElement_set_name_bstr(paVar11,puVar15,puVar10);
    if (iVar9 != 0) goto LAB_001385aa;
  }
  if (bVar3) {
    pbVar12 = apx_signatureParser_parse_type_reference(self,begin,end);
    iVar9 = 3;
    if (pbVar12 <= begin) goto LAB_001385aa;
  }
  else {
    pbVar12 = begin;
    if (bVar5) {
      paVar2 = self->state;
      paVar13 = (apx_signatureParserState_t *)malloc(0x10);
      if (paVar13 != (apx_signatureParserState_t *)0x0) {
        paVar13->is_record = true;
        paVar13->data_element = (apx_dataElement_t *)0x0;
      }
      self->state = paVar13;
      do {
        if (end <= begin) {
          bVar3 = true;
          goto LAB_001387c2;
        }
        pbVar12 = apx_signatureParser_parse_data_element(self,begin,end);
        if (pbVar12 <= begin) {
          self->error_code = 3;
          self->error_pos = begin;
          paVar13 = self->state;
          bVar3 = false;
          pbVar12 = begin;
          goto LAB_001387ba;
        }
        paVar11 = paVar2->data_element;
        if (paVar11 == (apx_dataElement_t *)0x0) {
          __assert_fail("parent->data_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                        ,0x15b,
                        "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        child = self->state->data_element;
        if (child == (apx_dataElement_t *)0x0) {
          __assert_fail("self->state->data_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                        ,0x15c,
                        "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        apx_dataElement_append_child(paVar11,child);
        paVar13 = self->state;
        paVar13->data_element = (apx_dataElement_t *)0x0;
        if (end <= pbVar12) {
          self->error_code = 3;
          self->error_pos = pbVar12;
          bVar3 = false;
          goto LAB_001387ba;
        }
        begin = pbVar12;
      } while (*pbVar12 != 0x7d);
      pbVar12 = pbVar12 + 1;
      bVar3 = true;
LAB_001387ba:
      apx_signatureParserState_delete(paVar13);
      self->state = paVar2;
      begin = pbVar12;
LAB_001387c2:
      pbVar12 = begin;
      if (!bVar3) {
        return (uint8_t *)0x0;
      }
    }
  }
  begin = pbVar12;
  if (bVar6) {
    if (bVar7) {
      if (bVar8) {
        pbVar14 = apx_signatureParser_parse_limits_i64(self,pbVar12,end);
      }
      else {
        pbVar14 = apx_signatureParser_parse_limits_u64(self,pbVar12,end);
      }
    }
    else if (bVar8) {
      pbVar14 = apx_signatureParser_parse_limits_i32(self,pbVar12,end);
    }
    else {
      pbVar14 = apx_signatureParser_parse_limits_u32(self,pbVar12,end);
    }
    begin = pbVar14;
    if ((pbVar14 <= pbVar12) && (begin = pbVar12, pbVar14 == (byte *)0x0)) {
      iVar9 = 3;
      goto LAB_001385aa;
    }
  }
  pbVar12 = begin;
  if ((begin < end) && (*begin == 0x5b)) {
    puVar10 = bstr_lstrip(begin + 1,end);
    if ((puVar10 < end) &&
       (puVar15 = apx_parserBase_parse_u32(puVar10,end,&local_34), puVar10 < puVar15)) {
      apx_dataElement_set_array_length(self->state->data_element,local_34);
      puVar10 = bstr_lstrip(puVar15,end);
      if (puVar10 < end) {
        if (*puVar10 == '*') {
          apx_dataElement_set_dynamic_array(self->state->data_element);
          puVar10 = bstr_lstrip(puVar10 + 1,end);
          if (end <= puVar10) goto LAB_001388de;
        }
        pbVar12 = (byte *)0x0;
        if (*puVar10 == ']') {
          pbVar12 = puVar10 + 1;
        }
        goto LAB_001388e0;
      }
    }
LAB_001388de:
    pbVar12 = (byte *)0x0;
  }
LAB_001388e0:
  if (begin < pbVar12) {
    return pbVar12;
  }
  if (pbVar12 != (byte *)0x0) {
    return begin;
  }
  iVar9 = 3;
LAB_001385aa:
  self->error_code = iVar9;
  self->error_pos = begin;
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_data_element(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   uint8_t const* name_begin = NULL;
   uint8_t const* name_end = NULL;
   uint8_t const* result = NULL;
   assert( (self != NULL) && (self->state != NULL) );

   if (self->state->is_record)
   {
      result = bstr_match_pair(next, end, '"', '"', '\\');
      if (result > next)
      {
         name_begin = next + 1; //Don't include first '"' character
         name_end = result;
         next = result + 1; //Move past second '"' character
      }
      else
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   if (next >= end)
   {
      return begin;
   }
   const char c = *next;
   bool is_signed_type = true;
   bool is_64_bit_type = false;
   bool check_limits = true;
   apx_typeCode_t type_code = APX_TYPE_CODE_NONE;
   apx_tokenClass_t token_class = APX_TOKEN_CLASS_DATA_ELEMENT;
   switch (c)
   {
   case '{':
      type_code = APX_TYPE_CODE_RECORD;
      check_limits = false;
      break;
   case '[':
      token_class = APX_TOKEN_GROUP_DECLARATION;
      check_limits = false;
      break;
   case '(':
      token_class = APX_TOKEN_FUNCTION_DECLARATION;
      check_limits = false;
      break;
   case 'a':
      type_code = APX_TYPE_CODE_CHAR;
      check_limits = false;
      break;
   case 'A':
      type_code = APX_TYPE_CODE_CHAR8;
      check_limits = false;
      break;
   case 'b':
      type_code = APX_TYPE_CODE_BOOL;
      check_limits = false;
      break;
   case 'B':
      type_code = APX_TYPE_CODE_BYTE;
      is_signed_type = false;
      break;
   case 'c':
      type_code = APX_TYPE_CODE_INT8;
      break;
   case 'C':
      type_code = APX_TYPE_CODE_UINT8;
      is_signed_type = false;
      break;
   case 'l':
      type_code = APX_TYPE_CODE_INT32;
      break;
   case 'L':
      type_code = APX_TYPE_CODE_UINT32;
      is_signed_type = false;
      break;
   case 'q':
      type_code = APX_TYPE_CODE_INT64;
      is_64_bit_type = true;
      break;
   case 'Q':
      type_code = APX_TYPE_CODE_UINT64;
      is_signed_type = false;
      is_64_bit_type = true;
      break;
   case 's':
      type_code = APX_TYPE_CODE_INT16;
      break;
   case 'S':
      type_code = APX_TYPE_CODE_UINT16;
      is_signed_type = false;
      break;
   case 'T':
      type_code = APX_TYPE_CODE_REF_ID; //Initial guess, might change while parsing continues
      check_limits = false;
      break;
   case 'u':
      type_code = APX_TYPE_CODE_CHAR16;
      check_limits = false;
      break;
   case 'U':
      type_code = APX_TYPE_CODE_CHAR32;
      check_limits = false;
      break;
   }
   if (token_class == APX_TOKEN_CLASS_DATA_ELEMENT)
   {
      if (type_code == APX_TYPE_CODE_NONE)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
      else
      {
         self->state->data_element = apx_dataElement_new(type_code);
         if (self->state->data_element == NULL)
         {
            apx_signatureParser_set_error(self, APX_MEM_ERROR, next);
            return NULL;
         }
         next++;
         if (name_begin != NULL)
         {
            assert((name_end != NULL) && (name_begin <= name_end));
            apx_error_t rc = apx_dataElement_set_name_bstr(self->state->data_element, name_begin, name_end);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
         }
      }
      if (type_code == APX_TYPE_CODE_REF_ID)
      {
         result = apx_signatureParser_parse_type_reference(self, next, end);
         if (result > next)
         {
            next = result;
         }
         else
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      else if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_signatureParserState_t* parent = self->state;
         self->state = apx_signatureParserState_new(true);
         while (next < end)
         {
            result = apx_signatureParser_parse_data_element(self, next, end);
            if (result > next)
            {
               next = result;
               assert(parent->data_element != NULL);
               assert(self->state->data_element != NULL);
               apx_dataElement_append_child(parent->data_element, self->state->data_element);
               self->state->data_element = NULL; //Move ownership to parent
            }
            else
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (next >= end)
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (*next == '}')
            {
               next++;
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               break;
            }
         }
      }
      if (check_limits)
      {
         if (is_64_bit_type)
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i64(self, next, end) : apx_signatureParser_parse_limits_u64(self, next, end);
         }
         else
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i32(self, next, end) : apx_signatureParser_parse_limits_u32(self, next, end);
         }
         if (result > next)
         {
            next = result;
         }
         else if (result == NULL)
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      result = apx_signatureParser_parse_array(self, next, end);
      if (result > next)
      {
         next = result;
      }
      else if (result == NULL)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   else
   {
      apx_signatureParser_set_error(self, APX_NOT_IMPLEMENTED_ERROR, next);
      return NULL;
   }
   return next;
}